

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O0

int __thiscall jrtplib::RTPPacketBuilder::SetMaximumPacketSize(RTPPacketBuilder *this,size_t max)

{
  uint8_t *buf;
  RTPMemoryManager *pRVar1;
  uint8_t *puVar2;
  uint8_t *newbuf;
  size_t max_local;
  RTPPacketBuilder *this_local;
  
  if (max == 0) {
    this_local._4_4_ = -0x13;
  }
  else {
    pRVar1 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    puVar2 = (uint8_t *)operator_new__(max,pRVar1,9);
    if (puVar2 == (uint8_t *)0x0) {
      this_local._4_4_ = -1;
    }
    else {
      buf = this->buffer;
      pRVar1 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
      RTPDeleteByteArray(buf,pRVar1);
      this->buffer = puVar2;
      this->maxpacksize = max;
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPPacketBuilder::SetMaximumPacketSize(size_t max)
{
	uint8_t *newbuf;

	if (max <= 0)
		return ERR_RTP_PACKBUILD_INVALIDMAXPACKETSIZE;
	newbuf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTPPACKETBUILDERBUFFER) uint8_t[max];
	if (newbuf == 0)
		return ERR_RTP_OUTOFMEM;
	
	RTPDeleteByteArray(buffer,GetMemoryManager());
	buffer = newbuf;
	maxpacksize = max;
	return 0;
}